

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O2

void __thiscall
lwlog::details::hour_clock_12_formatter::format
          (hour_clock_12_formatter *this,string *pattern,record_base *record)

{
  int iVar1;
  undefined4 extraout_var;
  uint32_t digit;
  uint32_t digit_00;
  uint32_t digit_01;
  char *__rhs;
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  long lVar2;
  
  iVar1 = (*record->_vptr_record_base[2])(record);
  lVar2 = CONCAT44(extraout_var,iVar1);
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_38,(datetime *)(ulong)*(byte *)(lVar2 + 0xd),digit);
  std::operator+(&local_d8,&local_38,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_f8,(datetime *)(ulong)*(byte *)(lVar2 + 0xe),digit_00);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&sStack_118,(datetime *)(ulong)*(byte *)(lVar2 + 0xf),digit_01);
  std::operator+(&local_78,&local_98,&sStack_118);
  __rhs = "am";
  if (0xb < *(byte *)(lVar2 + 0xd)) {
    __rhs = "pm";
  }
  std::operator+(&local_58,&local_78,__rhs);
  formatter::format_attribute<std::__cxx11::string>
            (pattern,(flag_pair *)flag::hour_clock_12,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::hour_clock_12,
				os::datetime::ensure_two_digit_format(time_point.hour)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.minute)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.second) 
					+ (time_point.hour >= 12 ? "pm" : "am")
			);
		}